

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O0

QString * FileHdrWrapper::translateMachine(QString *__return_storage_ptr__,DWORD val)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *other;
  _Self local_28;
  _Self local_20;
  DWORD local_14;
  QString *pQStack_10;
  DWORD val_local;
  
  local_14 = val;
  pQStack_10 = __return_storage_ptr__;
  sVar2 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_machine);
  if (sVar2 == 0) {
    initMachine();
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
       ::find(&s_machine,&local_14);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
       ::end(&s_machine);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    other = std::
            map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
            ::operator[](&s_machine,&local_14);
    QString::QString(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::translateMachine(DWORD val)
{
    if (s_machine.size() == 0) 
        initMachine();

    if (s_machine.find(val) == s_machine.end()) return "";
    return s_machine[val];
}